

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::ReduceL1LayerParams::_InternalSerialize
          (ReduceL1LayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  ulong *puVar1;
  void *data;
  bool bVar2;
  byte bVar3;
  LogMessage *other;
  ulong uVar4;
  ulong uVar5;
  int size;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong *puVar9;
  size_t __n;
  byte *pbVar10;
  LogFinisher local_69;
  LogMessage local_68;
  
  uVar8 = (this->_axes_cached_byte_size_).super___atomic_base<int>._M_i;
  if (0 < (int)uVar8) {
    pbVar10 = stream->end_;
    if (pbVar10 <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar10 = stream->end_;
    }
    if (pbVar10 <= target) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_69,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    *target = 10;
    pbVar10 = target + 1;
    uVar7 = uVar8;
    if (0x7f < uVar8) {
      do {
        target = pbVar10;
        *target = (byte)uVar7 | 0x80;
        uVar8 = uVar7 >> 7;
        pbVar10 = target + 1;
        bVar2 = 0x3fff < uVar7;
        uVar7 = uVar8;
      } while (bVar2);
    }
    target = target + 2;
    *pbVar10 = (byte)uVar8;
    puVar9 = (ulong *)(this->axes_).arena_or_elements_;
    puVar1 = puVar9 + (this->axes_).current_size_;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar5 = *puVar9;
      *target = (byte)uVar5;
      if (uVar5 < 0x80) {
        pbVar10 = target + 1;
      }
      else {
        *target = (byte)uVar5 | 0x80;
        target[1] = (byte)(uVar5 >> 7);
        pbVar10 = target + 2;
        if (0x3fff < uVar5) {
          uVar6 = (ulong)target[1];
          uVar5 = uVar5 >> 7;
          do {
            pbVar10[-1] = (byte)uVar6 | 0x80;
            uVar4 = uVar5 >> 7;
            *pbVar10 = (byte)uVar4;
            pbVar10 = pbVar10 + 1;
            uVar6 = uVar4 & 0xffffffff;
            bVar2 = 0x3fff < uVar5;
            uVar5 = uVar4;
          } while (bVar2);
        }
      }
      target = pbVar10;
      puVar9 = puVar9 + 1;
    } while (puVar9 < puVar1);
  }
  if (this->keepdims_ == true) {
    bVar3 = 1;
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      bVar3 = this->keepdims_;
    }
    *target = 0x10;
    target[1] = bVar3;
    target = target + 2;
  }
  if (this->reduceall_ == true) {
    bVar3 = 1;
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      bVar3 = this->reduceall_;
    }
    *target = 0x18;
    target[1] = bVar3;
    target = target + 2;
  }
  uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar5 & 1) != 0) {
    uVar5 = uVar5 & 0xfffffffffffffffc;
    data = *(void **)(uVar5 + 8);
    size = (int)*(undefined8 *)(uVar5 + 0x10);
    __n = (size_t)size;
    if ((long)stream->end_ - (long)target < (long)__n) {
      target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,target);
    }
    else {
      memcpy(target,data,__n);
      target = target + __n;
    }
  }
  return target;
}

Assistant:

uint8_t* ReduceL1LayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.ReduceL1LayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int64 axes = 1;
  {
    int byte_size = _axes_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteInt64Packed(
          1, _internal_axes(), byte_size, target);
    }
  }

  // bool keepDims = 2;
  if (this->_internal_keepdims() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(2, this->_internal_keepdims(), target);
  }

  // bool reduceAll = 3;
  if (this->_internal_reduceall() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(3, this->_internal_reduceall(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.ReduceL1LayerParams)
  return target;
}